

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O2

void __thiscall cppurses::Terminal::initialize_color_pairs(Terminal *this)

{
  short sVar1;
  short fg;
  ushort fg_00;
  short bg;
  short bg_00;
  uint uVar2;
  
  uVar2 = (uint)(byte)(0xf < _COLORS & this->is_initialized_) * 8 + 8;
  for (fg_00 = 0; fg_00 < uVar2; fg_00 = fg_00 + 1) {
    for (bg_00 = 0; (int)bg_00 < (int)uVar2; bg_00 = bg_00 + 1) {
      sVar1 = color_index(this,fg_00,bg_00);
      if (sVar1 != 0) {
        init_pair((int)sVar1,(int)(short)fg_00,(int)bg_00);
      }
    }
  }
  return;
}

Assistant:

bool Terminal::has_extended_colors() const
{
    if (is_initialized_)
        return COLORS >= 16;
    return false;
}